

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_base.hpp
# Opt level: O0

size_t jessilib::encode_codepoint_utf<char8_t,char8_t*>
                 (char8_t **out_destination,char32_t in_codepoint)

{
  size_t sVar1;
  char32_t in_codepoint_local;
  char8_t **out_destination_local;
  
  sVar1 = encode_codepoint_utf8<char8_t,char8_t*>(out_destination,in_codepoint);
  return sVar1;
}

Assistant:

constexpr size_t encode_codepoint_utf(T& out_destination, char32_t in_codepoint) {
	if constexpr (std::is_same_v<CharT, char8_t>) {
		return encode_codepoint_utf8<CharT, T>(out_destination, in_codepoint);
	}
	else if constexpr (std::is_same_v<CharT, char16_t>) {
		return encode_codepoint_utf16<CharT, T>(out_destination, in_codepoint);
	}
	else if constexpr (std::is_same_v<CharT, char32_t>) {
		return encode_codepoint_utf32<CharT, T>(out_destination, in_codepoint);
	}
	else if constexpr (std::is_same_v<CharT, wchar_t>) {
		return encode_codepoint_w<T>(out_destination, in_codepoint);
	}
#ifdef JESSILIB_CHAR_AS_UTF8
	else if constexpr (std::is_same_v<CharT, char>) {
		return encode_codepoint_utf8<CharT, T>(out_destination, in_codepoint);
	}
#endif // JESSILIB_CHAR_AS_UTF8
}